

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O2

IWindowPtr __thiscall cursespp::LayoutBase::FocusPrev(LayoutBase *this)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long *in_RSI;
  long lVar5;
  signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local> *this_00;
  IWindowPtr IVar6;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  long *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  (**(code **)(*in_RSI + 0x1d0))(&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  if (local_40 != (long *)0x0) {
    plVar3 = local_40;
    do {
      if (plVar3 != (long *)0x0) {
        plVar2 = (long *)__dynamic_cast(plVar3,&IWindow::typeinfo,&typeinfo,0);
        if (plVar2 != (long *)0x0) {
          (**(code **)(*plVar2 + 0x1c8))(this,plVar2);
          _Var4._M_pi = extraout_RDX;
          if ((this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable !=
              (_func_int **)0x0) goto LAB_001877f3;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &(this->super_Window).super_IWindow.super_IDisplayable);
        }
      }
      plVar3 = (long *)(**(code **)(*plVar3 + 0x128))(plVar3);
    } while (plVar3 != in_RSI);
  }
  lVar5 = in_RSI[0x3f];
  *(int *)(in_RSI + 0x3f) = (int)lVar5 + -1;
  if ((int)lVar5 < 1) {
    if (*(int *)((long)in_RSI + 0x1fc) == 0) {
      iVar1 = (int)((ulong)(in_RSI[0x3d] - in_RSI[0x3c]) >> 4) + -1;
      lVar5 = 0x180;
    }
    else {
      lVar5 = 0x138;
      iVar1 = -2;
    }
    *(int *)(in_RSI + 0x3f) = iVar1;
    this_00 = (signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local> *)
              (lVar5 + (long)in_RSI);
  }
  else {
    this_00 = (signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local> *)0x0;
  }
  (**(code **)(*in_RSI + 0x260))(local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  if (this_00 != (signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local> *)0x0
     ) {
    sigslot::signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local>::
    operator()(this_00,FocusBackward);
  }
  (**(code **)(*in_RSI + 0x1d0))(this);
  _Var4._M_pi = extraout_RDX_00;
LAB_001877f3:
  IVar6.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  IVar6.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IWindowPtr)IVar6.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IWindowPtr LayoutBase::FocusPrev() {
    sigslot::signal1<FocusDirection>* notify = nullptr;

    /* GetFocus() will return the focused Window recursively. once we know
    what it is, see if it can focus next. if it cannot, see if its parent
    can, and so on, until we reach ourselves. reaching ourself is the base
    case, and we drop through to the actual focus logic below.

    NOTE: IF YOU UPDATE THIS LOGIC, ALSO UPDATE THE CORRESPONDING CODE IN
    LayoutBase::FocusNext() */
    auto currFocus = this->GetFocus().get();
    if (currFocus) {
        do {
            auto asLayout = dynamic_cast<LayoutBase*>(currFocus);
            if (asLayout) {
                auto prevFocus = asLayout->FocusPrev();
                if (prevFocus) {
                    if (notify) {
                        (*notify)(FocusForward);
                    }
                    return prevFocus;
                }
            }

            Window* parent = (Window*) currFocus->GetParent();
            if (parent == this) { /* base case/stop condition. this should always be hit */
                break;
            }
            currFocus = parent;
        } while (true);
    }

    /*** actual focus logic starts here ***/

    --this->focused;
    if (this->focused < 0) {
        if (this->focusMode == FocusModeCircular) {
            this->focused = (int) this->focusable.size() - 1;
            notify = &FocusWrapped;
        }
        else {
            this->focused = NO_FOCUS;
            notify = &FocusTerminated;
        }
    }

    this->EnsureValidFocusFromPrev();

    if (notify) {
        (*notify)(FocusBackward);
    }

    return GetFocus();
}